

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

void icu_63::initLanguageFactories(void)

{
  UBool UVar1;
  UStack *this;
  ICULanguageBreakFactory *this_00;
  code *in_RSI;
  ICULanguageBreakFactory *local_50;
  UStack *local_40;
  ICULanguageBreakFactory *builtIn;
  UErrorCode local_c [2];
  UErrorCode status;
  
  local_c[0] = U_ZERO_ERROR;
  this = (UStack *)UMemory::operator_new((UMemory *)0x28,(size_t)in_RSI);
  local_40 = (UStack *)0x0;
  if (this != (UStack *)0x0) {
    in_RSI = _deleteFactory;
    UStack::UStack(this,_deleteFactory,(UElementsAreEqual *)0x0,local_c);
    local_40 = this;
  }
  gLanguageBreakFactories = local_40;
  if (local_40 != (UStack *)0x0) {
    UVar1 = ::U_SUCCESS(local_c[0]);
    if (UVar1 != '\0') {
      this_00 = (ICULanguageBreakFactory *)UMemory::operator_new((UMemory *)0x10,(size_t)in_RSI);
      local_50 = (ICULanguageBreakFactory *)0x0;
      if (this_00 != (ICULanguageBreakFactory *)0x0) {
        ICULanguageBreakFactory::ICULanguageBreakFactory(this_00,local_c);
        local_50 = this_00;
      }
      UStack::push(gLanguageBreakFactories,local_50,local_c);
    }
  }
  ucln_common_registerCleanup_63(UCLN_COMMON_RBBI,rbbi_cleanup);
  return;
}

Assistant:

static void U_CALLCONV initLanguageFactories() {
    UErrorCode status = U_ZERO_ERROR;
    U_ASSERT(gLanguageBreakFactories == NULL);
    gLanguageBreakFactories = new UStack(_deleteFactory, NULL, status);
    if (gLanguageBreakFactories != NULL && U_SUCCESS(status)) {
        ICULanguageBreakFactory *builtIn = new ICULanguageBreakFactory(status);
        gLanguageBreakFactories->push(builtIn, status);
#ifdef U_LOCAL_SERVICE_HOOK
        LanguageBreakFactory *extra = (LanguageBreakFactory *)uprv_svc_hook("languageBreakFactory", &status);
        if (extra != NULL) {
            gLanguageBreakFactories->push(extra, status);
        }
#endif
    }
    ucln_common_registerCleanup(UCLN_COMMON_RBBI, rbbi_cleanup);
}